

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O0

ring_buffer_size_t
PaUtil_ReadRingBuffer(PaUtilRingBuffer *rbuf,void *data,ring_buffer_size_t elementCount)

{
  ring_buffer_size_t elementCount_00;
  ring_buffer_size_t in_RDX;
  PaUtilRingBuffer *in_RSI;
  PaUtilRingBuffer *in_RDI;
  void *data2;
  void *data1;
  ring_buffer_size_t numRead;
  ring_buffer_size_t size2;
  ring_buffer_size_t size1;
  void *local_40;
  ring_buffer_size_t *in_stack_ffffffffffffffc8;
  void **in_stack_ffffffffffffffd0;
  ring_buffer_size_t *in_stack_ffffffffffffffd8;
  void **in_stack_ffffffffffffffe0;
  
  elementCount_00 =
       PaUtil_GetRingBufferReadRegions
                 (in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                  in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((long)in_stack_ffffffffffffffd8 < 1) {
    memcpy(in_RSI,in_stack_ffffffffffffffc8,
           (long)in_stack_ffffffffffffffe0 * in_RDI->elementSizeBytes);
  }
  else {
    memcpy(in_RSI,in_stack_ffffffffffffffc8,
           (long)in_stack_ffffffffffffffe0 * in_RDI->elementSizeBytes);
    memcpy((ring_buffer_size_t *)
           ((long)&in_RSI->bufferSize + (long)in_stack_ffffffffffffffe0 * in_RDI->elementSizeBytes),
           local_40,(long)in_stack_ffffffffffffffd8 * in_RDI->elementSizeBytes);
  }
  PaUtil_AdvanceRingBufferReadIndex(in_RDI,elementCount_00);
  return elementCount_00;
}

Assistant:

ring_buffer_size_t PaUtil_ReadRingBuffer( PaUtilRingBuffer *rbuf, void *data, ring_buffer_size_t elementCount )
{
    ring_buffer_size_t size1, size2, numRead;
    void *data1, *data2;
    numRead = PaUtil_GetRingBufferReadRegions( rbuf, elementCount, &data1, &size1, &data2, &size2 );
    if( size2 > 0 )
    {
        memcpy( data, data1, size1*rbuf->elementSizeBytes );
        data = ((char *)data) + size1*rbuf->elementSizeBytes;
        memcpy( data, data2, size2*rbuf->elementSizeBytes );
    }
    else
    {
        memcpy( data, data1, size1*rbuf->elementSizeBytes );
    }
    PaUtil_AdvanceRingBufferReadIndex( rbuf, numRead );
    return numRead;
}